

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O1

void __thiscall kj::Arena::Arena(Arena *this,ArrayPtr<unsigned_char> scratch)

{
  ulong uVar1;
  ulong uVar2;
  ChunkHeader *pCVar3;
  
  uVar2 = scratch.size_;
  pCVar3 = (ChunkHeader *)scratch.ptr;
  uVar1 = 0x18;
  if (0x18 < uVar2) {
    uVar1 = uVar2;
  }
  this->nextChunkSize = uVar1;
  this->chunkList = (ChunkHeader *)0x0;
  this->objectList = (ObjectHeader *)0x0;
  this->currentChunk = (ChunkHeader *)0x0;
  if (0x18 < uVar2) {
    pCVar3->end = (byte *)((long)&pCVar3->next + uVar2);
    pCVar3->pos = (byte *)(pCVar3 + 1);
    pCVar3->next = (ChunkHeader *)0x0;
    this->currentChunk = pCVar3;
  }
  return;
}

Assistant:

Arena::Arena(ArrayPtr<byte> scratch)
    : nextChunkSize(kj::max(sizeof(ChunkHeader), scratch.size())) {
  if (scratch.size() > sizeof(ChunkHeader)) {
    ChunkHeader* chunk = reinterpret_cast<ChunkHeader*>(scratch.begin());
    chunk->end = scratch.end();
    chunk->pos = reinterpret_cast<byte*>(chunk + 1);
    chunk->next = nullptr;  // Never actually observed.

    // Don't place the chunk in the chunk list because it's not ours to delete.  Just make it the
    // current chunk so that we'll allocate from it until it is empty.
    currentChunk = chunk;
  }
}